

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_builder.h
# Opt level: O3

Instruction * __thiscall
spvtools::opt::InstructionBuilder::AddUnaryOp
          (InstructionBuilder *this,uint32_t type_id,Op opcode,uint32_t operand1)

{
  IRContext *pIVar1;
  uint32_t res_id;
  Instruction *pIVar2;
  string message;
  size_type __dnew;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_b0;
  char *local_a8;
  undefined1 local_a0 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_80;
  undefined1 local_78 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  if (type_id == 0) {
    res_id = 0;
LAB_001b8a63:
    pIVar2 = (Instruction *)operator_new(0x70);
    pIVar1 = this->context_;
    local_78._24_8_ = local_78 + 0x10;
    local_78._0_8_ = &PTR__SmallVector_003d7c78;
    local_58._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_78._16_4_ = operand1;
    local_78._8_8_ = 1;
    local_a8 = (char *)CONCAT44(local_a8._4_4_,1);
    local_a0._0_8_ = &PTR__SmallVector_003d7c78;
    local_a0._8_8_ = 0;
    local_a0._24_8_ = local_a0 + 0x10;
    local_80._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)local_a0,(SmallVector<unsigned_int,_2UL> *)local_78
              );
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
    _M_range_initialize<spvtools::opt::Operand_const*>
              ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_48,
               &local_a8,local_78);
    Instruction::Instruction(pIVar2,pIVar1,opcode,type_id,res_id,(OperandList *)&local_48);
    local_b0._M_head_impl = pIVar2;
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&local_48)
    ;
    local_a0._0_8_ = &PTR__SmallVector_003d7c78;
    if (local_80._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_80,local_80._M_head_impl);
    }
    local_80._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_78._0_8_ = &PTR__SmallVector_003d7c78;
    if (local_58._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_58,local_58._M_head_impl);
    }
    pIVar2 = AddInstruction(this,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                  *)&local_b0);
    if (local_b0._M_head_impl != (Instruction *)0x0) {
      (*((local_b0._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
        _vptr_IntrusiveNodeBase[1])();
    }
  }
  else {
    pIVar1 = this->context_;
    res_id = Module::TakeNextIdBound
                       ((pIVar1->module_)._M_t.
                        super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                        .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl);
    if ((res_id == 0) && ((pIVar1->consumer_).super__Function_base._M_manager != (_Manager_type)0x0)
       ) {
      local_78._0_8_ = (_func_int **)0x25;
      local_a8 = local_a0 + 8;
      local_a8 = (char *)std::__cxx11::string::_M_create((ulong *)&local_a8,(ulong)local_78);
      local_a0._8_8_ = local_78._0_8_;
      builtin_strncpy(local_a8,"ID overflow. Try running compact-ids.",0x25);
      local_a0._0_8_ = local_78._0_8_;
      local_a8[local_78._0_8_] = '\0';
      local_78._0_8_ = (_func_int **)0x0;
      local_78._8_8_ = 0;
      local_78._16_4_ = (array<signed_char,_4UL>)0x0;
      local_78._20_4_ = (array<signed_char,_4UL>)0x0;
      std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
      ::operator()(&pIVar1->consumer_,SPV_MSG_ERROR,"",(spv_position_t *)local_78,local_a8);
      if (local_a8 != local_a0 + 8) {
        operator_delete(local_a8,local_a0._8_8_ + 1);
      }
    }
    else if (res_id != 0) goto LAB_001b8a63;
    pIVar2 = (Instruction *)0x0;
  }
  return pIVar2;
}

Assistant:

Instruction* AddUnaryOp(uint32_t type_id, spv::Op opcode, uint32_t operand1) {
    uint32_t result_id = 0;
    if (type_id != 0) {
      result_id = GetContext()->TakeNextId();
      if (result_id == 0) {
        return nullptr;
      }
    }
    std::unique_ptr<Instruction> newUnOp(new Instruction(
        GetContext(), opcode, type_id, result_id,
        {{spv_operand_type_t::SPV_OPERAND_TYPE_ID, {operand1}}}));
    return AddInstruction(std::move(newUnOp));
  }